

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall GlobOpt::OptPeep(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  GlobOptBlockData *pGVar4;
  RegOpnd *pRVar5;
  Opnd *pOVar6;
  Opnd *pOVar7;
  ByteCodeUsesInstr *this_00;
  ByteCodeUsesInstr *bytecodeUse;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    return instr;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == Ld_A) {
LAB_00587b79:
    pOVar6 = IR::Instr::GetSrc1(instr);
    pOVar7 = IR::Instr::GetDst(instr);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar7);
    if (!bVar2) {
      return instr;
    }
    bVar2 = IR::Opnd::IsEqual(pOVar7,pOVar6);
    if (!bVar2) {
      return instr;
    }
    pOVar6 = IR::Instr::UnlinkDst(instr);
    bVar2 = IR::Opnd::GetIsJITOptimizedReg(pOVar6);
    if (!bVar2) {
      this_00 = IR::ByteCodeUsesInstr::New(instr);
      IR::Instr::SetDst(&this_00->super_Instr,pOVar6);
      IR::Instr::InsertAfter(instr,&this_00->super_Instr);
    }
    IR::Instr::FreeSrc1(instr);
    instr->m_opcode = Nop;
    return instr;
  }
  if (2 < (ushort)(OVar1 - DeadBrEqual)) {
    if (OVar1 != DeadBrOnHasProperty) {
      if (OVar1 != Ld_I4) {
        return instr;
      }
      goto LAB_00587b79;
    }
    pOVar6 = IR::Instr::GetSrc1(instr);
    if (src1Val != (Value *)0x0) {
      pVVar3 = ::Value::GetValueInfo(src1Val);
      bVar2 = ValueType::IsPrimitive(&pVVar3->super_ValueType);
      if (bVar2) goto LAB_00587b5d;
    }
    bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
    if (!bVar2) {
      return instr;
    }
    pGVar4 = CurrentBlockData(this);
    pRVar5 = IR::Opnd::AsRegOpnd(pOVar6);
    bVar2 = GlobOptBlockData::IsTypeSpecialized(pGVar4,&pRVar5->m_sym->super_Sym);
    if (!bVar2) {
      return instr;
    }
LAB_00587b5d:
    CaptureByteCodeSymUses(this,instr);
    instr->m_opcode = Nop;
    return instr;
  }
  pOVar6 = IR::Instr::GetSrc1(instr);
  pOVar7 = IR::Instr::GetSrc2(instr);
  if (src1Val == (Value *)0x0) {
LAB_00587a49:
    bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
    if (!bVar2) {
      return instr;
    }
    pGVar4 = CurrentBlockData(this);
    pRVar5 = IR::Opnd::AsRegOpnd(pOVar6);
    bVar2 = GlobOptBlockData::IsTypeSpecialized(pGVar4,&pRVar5->m_sym->super_Sym);
    if (!bVar2) {
      return instr;
    }
  }
  else {
    pVVar3 = ::Value::GetValueInfo(src1Val);
    bVar2 = ValueType::IsPrimitive(&pVVar3->super_ValueType);
    if (!bVar2) goto LAB_00587a49;
  }
  if (src2Val != (Value *)0x0) {
    pVVar3 = ::Value::GetValueInfo(src2Val);
    bVar2 = ValueType::IsPrimitive(&pVVar3->super_ValueType);
    if (bVar2) goto LAB_00587adc;
  }
  bVar2 = IR::Opnd::IsRegOpnd(pOVar7);
  if (!bVar2) {
    return instr;
  }
  pGVar4 = CurrentBlockData(this);
  pRVar5 = IR::Opnd::AsRegOpnd(pOVar7);
  bVar2 = GlobOptBlockData::IsTypeSpecialized(pGVar4,&pRVar5->m_sym->super_Sym);
  if (!bVar2) {
    return instr;
  }
LAB_00587adc:
  CaptureByteCodeSymUses(this,instr);
  instr->m_opcode = Nop;
  return instr;
}

Assistant:

IR::Instr *
GlobOpt::OptPeep(IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    IR::Opnd *dst, *src1, *src2;

    if (this->IsLoopPrePass())
    {
        return instr;
    }

    switch (instr->m_opcode)
    {
        case Js::OpCode::DeadBrEqual:
        case Js::OpCode::DeadBrRelational:
        case Js::OpCode::DeadBrSrEqual:
            src1 = instr->GetSrc1();
            src2 = instr->GetSrc2();

            // These branches were turned into dead branches because they were unnecessary (branch to next, ...).
            // The DeadBr are necessary in case the evaluation of the sources have side-effects.
            // If we know for sure the srcs are primitive or have been type specialized, we don't need these instructions
            if (((src1Val && src1Val->GetValueInfo()->IsPrimitive()) || (src1->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src1->AsRegOpnd()->m_sym))) &&
                ((src2Val && src2Val->GetValueInfo()->IsPrimitive()) || (src2->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src2->AsRegOpnd()->m_sym))))
            {
                this->CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
        case Js::OpCode::DeadBrOnHasProperty:
            src1 = instr->GetSrc1();

            if (((src1Val && src1Val->GetValueInfo()->IsPrimitive()) || (src1->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src1->AsRegOpnd()->m_sym))))
            {
                this->CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
        case Js::OpCode::Ld_A:
        case Js::OpCode::Ld_I4:
            src1 = instr->GetSrc1();
            dst = instr->GetDst();

            if (dst->IsRegOpnd() && dst->IsEqual(src1))
            {
                dst = instr->UnlinkDst();
                if (!dst->GetIsJITOptimizedReg())
                {
                    IR::ByteCodeUsesInstr *bytecodeUse = IR::ByteCodeUsesInstr::New(instr);
                    bytecodeUse->SetDst(dst);
                    instr->InsertAfter(bytecodeUse);
                }
                instr->FreeSrc1();
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
    }
    return instr;
}